

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O2

string * __thiscall
CLI::Option::help_positional_abi_cxx11_(string *__return_storage_ptr__,Option *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->pname_);
  if (this->expected_ < 2) {
    if (this->expected_ != -1) goto LAB_0010f855;
    ::std::operator+(&local_80,__return_storage_ptr__,"...");
    this_00 = &local_80;
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)this_00);
  }
  else {
    ::std::operator+(&local_40,__return_storage_ptr__,"(");
    std::__cxx11::to_string(&local_60,this->expected_);
    ::std::operator+(&local_a0,&local_40,&local_60);
    ::std::operator+(&local_80,&local_a0,"x)");
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::__cxx11::string::~string((string *)&local_60);
    this_00 = &local_40;
  }
  ::std::__cxx11::string::~string((string *)this_00);
LAB_0010f855:
  bVar1 = (this->super_OptionBase<CLI::Option>).required_;
  if (bVar1 == true) {
    ::std::__cxx11::string::string((string *)&local_80,(string *)__return_storage_ptr__);
  }
  else {
    ::std::operator+(&local_a0,"[",__return_storage_ptr__);
    ::std::operator+(&local_80,&local_a0,"]");
  }
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_80);
  if (bVar1 == false) {
    ::std::__cxx11::string::~string((string *)&local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string help_positional() const {
        std::string out = pname_;
        if(get_expected() > 1)
            out = out + "(" + std::to_string(get_expected()) + "x)";
        else if(get_expected() == -1)
            out = out + "...";
        out = get_required() ? out : "[" + out + "]";
        return out;
    }